

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations
          (StoreLPJointObservation *this,Index curAgent,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indIndices)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  pointer puVar2;
  ulong uVar3;
  ostream *poVar4;
  EParse *this_00;
  Index oi;
  ulong uVar5;
  ulong uVar6;
  Index joI;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_230 [2];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  E e;
  stringstream msg;
  ostream local_1a8 [376];
  
  pPVar1 = this->_m_po;
  puVar2 = (indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1->_m_nrA ==
      (long)(indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 >> 2) {
    uVar6 = (ulong)curAgent;
    if (pPVar1->_m_nrA == uVar6) {
      joI = 0;
      joI = (**(code **)(*(long *)&(pPVar1->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0xe8))
                      (pPVar1->_m_decPOMDPDiscrete,indIndices);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->_m_po->_m_lp_JOI,&joI);
    }
    else if (puVar2[uVar6] == pPVar1->_m_anyJOIndex) {
      uVar3 = (**(code **)(*(long *)&(pPVar1->_m_decPOMDPDiscrete->
                                     super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 200))
                        (pPVar1->_m_decPOMDPDiscrete,curAgent);
      for (uVar5 = 0; uVar5 < uVar3; uVar5 = (ulong)((uint)uVar5 + 1)) {
        (indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (uint)uVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,indIndices);
        MatchingJointObservations
                  (this,curAgent + 1,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1f8);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230,indIndices);
      MatchingJointObservations
                (this,curAgent + 1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230)
      ;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_230);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar4 = std::operator<<(local_1a8,"individual obs indices vector has wrong size. (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," while nrAgents is ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,"at(");
  poVar4 = DPOMDPFormatParsing::operator<<(poVar4,&this->_m_po->_m_first->_pos);
  poVar4 = std::operator<<(poVar4,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  this_00 = (EParse *)__cxa_allocate_exception(0x28);
  EParse::EParse(this_00,&msg);
  __cxa_throw(this_00,&EParse::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations (Index curAgent, vector<Index> indIndices) const
{
    if(_m_po->_m_nrA != indIndices.size())
    {
        stringstream msg;
        msg << "individual obs indices vector has wrong size. ("<<indIndices.size() << 
            " while nrAgents is " <<_m_po->_m_nrA << ")" << "at(" << 
            _m_po->_m_first->get_position() << ")" << endl;;
        throw EParse(msg);
    }
    if(curAgent == _m_po->_m_nrA) //past last agent: all work done
    {
        Index joI = 0;
        try
        {
            joI = _m_po->GetDecPOMDPDiscrete()->IndividualToJointObservationIndices(
                    indIndices);
            _m_po->_m_lp_JOI.push_back(joI);
        }
        catch(E e)
        {
            stringstream ss; ss <<e.SoftPrint() << "at(" << _m_po->_m_first->get_position() <<
                ")" << endl;
            throw EParse(ss);
        }
        if(DEBUG_PARSE)
        {
            cout<<"MatchingJointObservations: joint observation index for < ";
            vector<Index>::iterator it = indIndices.begin();
            vector<Index>::iterator last = indIndices.end();
            while(it != last){ cout << *it <<" "; it++;}
            cout <<   "> = "<<joI<<endl;
        }
    }
    else //not past last agent: work to be done
    {
        if(indIndices[curAgent] == _m_po->_m_anyJOIndex)
        {
            //do for each action of this agent
            size_t nrObs = _m_po->GetDecPOMDPDiscrete()->GetNrObservations(curAgent);
            for(Index oi=0; oi < nrObs; oi++)
            {
                indIndices[curAgent] = oi;
                MatchingJointObservations(curAgent+1, indIndices);
            }
        }
        else
            MatchingJointObservations(curAgent+1, indIndices);
    }
}